

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O2

bool __thiscall cmQtAutoGenerator::InfoT::GetUInt(InfoT *this,string *key,uint *value,bool required)

{
  bool bVar1;
  bool bVar2;
  UInt UVar3;
  Value *this_00;
  string_view message;
  string local_48;
  
  this_00 = Json::Value::operator[](&this->Json_,key);
  bVar1 = Json::Value::isUInt(this_00);
  if (bVar1) {
    UVar3 = Json::Value::asUInt(this_00);
    *value = UVar3;
    bVar2 = true;
  }
  else {
    bVar1 = Json::Value::isNull(this_00);
    bVar2 = true;
    if (!bVar1 || required) {
      cmStrCat<std::__cxx11::string_const&,char_const(&)[29]>(&local_48,key,(char (*) [29])0x6ab3e0)
      ;
      message._M_str = local_48._M_dataplus._M_p;
      message._M_len = local_48._M_string_length;
      LogError(this,message);
      std::__cxx11::string::~string((string *)&local_48);
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool cmQtAutoGenerator::InfoT::GetUInt(std::string const& key,
                                       unsigned int& value,
                                       bool required) const
{
  Json::Value const& jval = this->Json_[key];
  if (jval.isUInt()) {
    value = jval.asUInt();
  } else {
    if (!jval.isNull() || required) {
      return this->LogError(cmStrCat(key, " is not an unsigned integer."));
    }
  }
  return true;
}